

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::MapEntryMessageComparator::operator()
          (MapEntryMessageComparator *this,Message *a,Message *b)

{
  FieldDescriptor *pFVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int32 iVar5;
  int32 iVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint uVar9;
  LogMessage *other;
  int64 iVar10;
  int64 iVar11;
  uint64 uVar12;
  uint64 uVar13;
  Reflection *this_00;
  char *__n;
  ulong uVar14;
  string second;
  string first;
  undefined1 local_88 [32];
  undefined1 local_68 [56];
  
  (*(a->super_MessageLite)._vptr_MessageLite[0x15])(a);
  pFVar1 = this->field_;
  if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_88._0_8_ = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x30),(_func_void_FieldDescriptor_ptr **)local_68,
               (FieldDescriptor **)local_88);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar1 + 0x38) * 4))
  {
  case 1:
    iVar5 = Reflection::GetInt32(this_00,a,this->field_);
    iVar6 = Reflection::GetInt32(this_00,b,this->field_);
    bVar3 = SBORROW4(iVar5,iVar6);
    bVar4 = iVar5 - iVar6 < 0;
    goto LAB_0029cfb4;
  case 2:
    iVar10 = Reflection::GetInt64(this_00,a,this->field_);
    iVar11 = Reflection::GetInt64(this_00,b,this->field_);
    bVar3 = SBORROW8(iVar10,iVar11);
    bVar4 = iVar10 - iVar11 < 0;
LAB_0029cfb4:
    bVar4 = bVar3 != bVar4;
    break;
  case 3:
    uVar7 = Reflection::GetUInt32(this_00,a,this->field_);
    uVar8 = Reflection::GetUInt32(this_00,b,this->field_);
    bVar4 = uVar7 < uVar8;
    break;
  case 4:
    uVar12 = Reflection::GetUInt64(this_00,a,this->field_);
    uVar13 = Reflection::GetUInt64(this_00,b,this->field_);
    bVar4 = uVar12 < uVar13;
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x80f);
    other = internal::LogMessage::operator<<((LogMessage *)local_68,"Invalid key for map field.");
    internal::LogFinisher::operator=((LogFinisher *)local_88,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
    bVar4 = true;
    break;
  case 7:
    bVar3 = Reflection::GetBool(this_00,a,this->field_);
    bVar4 = Reflection::GetBool(this_00,b,this->field_);
    bVar4 = !bVar3 && bVar4;
    break;
  case 9:
    Reflection::GetString_abi_cxx11_((string *)local_68,this_00,a,this->field_);
    Reflection::GetString_abi_cxx11_((string *)local_88,this_00,b,this->field_);
    uVar2 = local_88._0_8_;
    __n = (char *)local_68._8_8_;
    if ((ulong)local_88._8_8_ < (ulong)local_68._8_8_) {
      __n = (char *)local_88._8_8_;
    }
    if (__n == (char *)0x0) {
LAB_0029cef8:
      uVar14 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_68._8_8_ - local_88._8_8_)) {
        uVar14 = local_68._8_8_ - local_88._8_8_;
      }
      if (0x7ffffffe < (long)uVar14) {
        uVar14 = 0;
      }
    }
    else {
      uVar9 = memcmp((void *)local_68._0_8_,(void *)local_88._0_8_,(size_t)__n);
      uVar14 = (ulong)uVar9;
      if (uVar9 == 0) goto LAB_0029cef8;
    }
    if ((FieldDescriptor *)uVar2 != (FieldDescriptor *)(local_88 + 0x10)) {
      operator_delete((void *)uVar2);
    }
    bVar4 = (bool)((byte)(uVar14 >> 0x1f) & 1);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  return bVar4;
}

Assistant:

bool operator()(const Message* a, const Message* b) {
    const Reflection* reflection = a->GetReflection();
    switch (field_->cpp_type()) {
      case FieldDescriptor::CPPTYPE_BOOL: {
        bool first = reflection->GetBool(*a, field_);
        bool second = reflection->GetBool(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT32: {
        int32 first = reflection->GetInt32(*a, field_);
        int32 second = reflection->GetInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        int64 first = reflection->GetInt64(*a, field_);
        int64 second = reflection->GetInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        uint32 first = reflection->GetUInt32(*a, field_);
        uint32 second = reflection->GetUInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 first = reflection->GetUInt64(*a, field_);
        uint64 second = reflection->GetUInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        std::string first = reflection->GetString(*a, field_);
        std::string second = reflection->GetString(*b, field_);
        return first < second;
      }
      default:
        GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
        return true;
    }
  }